

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-proxy.c
# Opt level: O1

char * platform_setup_local_proxy(Socket *socket,char *cmd)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  char *pcVar4;
  char *fmt;
  int from_cmd_pipe [2];
  int to_cmd_pipe [2];
  int cmd_err_pipe [2];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  iVar1 = pipe(&local_20);
  if (((iVar1 < 0) || (iVar1 = pipe(&local_28), iVar1 < 0)) || (iVar1 = pipe(&local_18), iVar1 < 0))
  {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fmt = "pipe: %s";
  }
  else {
    cloexec(local_1c);
    cloexec(local_28);
    cloexec(local_18);
    _Var2 = fork();
    if (_Var2 == 0) {
      close(0);
      close(1);
      dup2(local_20,0);
      dup2(local_24,1);
      close(local_20);
      close(local_24);
      dup2(local_14,2);
      noncloexec(0);
      noncloexec(1);
      execl("/bin/sh","sh","-c",cmd,0);
      _exit(0xff);
    }
    if (-1 < _Var2) {
      close(local_20);
      close(local_24);
      close(local_14);
      setup_fd_socket(socket,local_28,local_1c,local_18);
      return (char *)0x0;
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fmt = "fork: %s";
  }
  pcVar4 = dupprintf(fmt,pcVar4);
  return pcVar4;
}

Assistant:

char *platform_setup_local_proxy(Socket *socket, const char *cmd)
{
    /*
     * Create the pipes to the proxy command, and spawn the proxy
     * command process.
     */
    int to_cmd_pipe[2], from_cmd_pipe[2], cmd_err_pipe[2];
    if (pipe(to_cmd_pipe) < 0 ||
        pipe(from_cmd_pipe) < 0 ||
        pipe(cmd_err_pipe) < 0) {
        return dupprintf("pipe: %s", strerror(errno));
    }
    cloexec(to_cmd_pipe[1]);
    cloexec(from_cmd_pipe[0]);
    cloexec(cmd_err_pipe[0]);

    int pid = fork();
    if (pid == 0) {
        close(0);
        close(1);
        dup2(to_cmd_pipe[0], 0);
        dup2(from_cmd_pipe[1], 1);
        close(to_cmd_pipe[0]);
        close(from_cmd_pipe[1]);
        dup2(cmd_err_pipe[1], 2);
        noncloexec(0);
        noncloexec(1);
        execl("/bin/sh", "sh", "-c", cmd, (void *)NULL);
        _exit(255);
    }

    if (pid < 0) {
        return dupprintf("fork: %s", strerror(errno));
    }

    close(to_cmd_pipe[0]);
    close(from_cmd_pipe[1]);
    close(cmd_err_pipe[1]);

    setup_fd_socket(socket, from_cmd_pipe[0], to_cmd_pipe[1], cmd_err_pipe[0]);

    return NULL;
}